

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O1

bool __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::Run
          (TwoDimensionalInverseFastFourierTransform *this,Matrix *real_part_input,
          Matrix *imag_part_input,Matrix *real_part_output,Matrix *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_04;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_05;
  pointer pdVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer ppdVar6;
  pointer ppdVar7;
  void *pvVar8;
  bool bVar9;
  pointer pvVar10;
  pointer pvVar11;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  size_type __new_size;
  long lVar15;
  
  if ((this->is_valid_ == true) && (real_part_input->num_row_ == this->num_row_)) {
    bVar14 = false;
    if ((real_part_input->num_column_ == this->num_column_) &&
       ((((bVar14 = false, imag_part_input->num_row_ == this->num_row_ &&
          (bVar14 = false, buffer != (Buffer *)0x0)) && (imag_part_output != (Matrix *)0x0)) &&
        ((real_part_output != (Matrix *)0x0 && (imag_part_input->num_column_ == this->num_column_)))
        ))) {
      __new_size = (size_type)this->fft_length_;
      this_00 = &buffer->real_part_input_;
      if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      }
      this_01 = &buffer->imag_part_input_;
      if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      this_02 = &buffer->first_real_part_outputs_;
      if (((long)(buffer->first_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->first_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_02,__new_size);
      }
      this_03 = &buffer->first_imag_part_outputs_;
      if (((long)(buffer->first_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->first_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_03,__new_size);
      }
      this_04 = &buffer->second_real_part_outputs_;
      if (((long)(buffer->second_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->second_real_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_04,__new_size);
      }
      this_05 = &buffer->second_imag_part_outputs_;
      if (((long)(buffer->second_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(buffer->second_imag_part_outputs_).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size
          != 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize(this_05,__new_size);
      }
      iVar2 = this->fft_length_;
      if ((real_part_output->num_row_ != iVar2) || (real_part_output->num_column_ != iVar2)) {
        Matrix::Resize(real_part_output,iVar2,iVar2);
      }
      iVar2 = this->fft_length_;
      if ((imag_part_output->num_row_ != iVar2) || (imag_part_output->num_column_ != iVar2)) {
        Matrix::Resize(imag_part_output,iVar2,iVar2);
      }
      pdVar3 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar5 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar2 = this->num_row_;
      pdVar1 = pdVar3 + iVar2;
      if (pdVar1 != pdVar4) {
        memset(pdVar1,0,((long)pdVar4 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
      pdVar1 = pdVar5 + iVar2;
      pdVar4 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pdVar1 != pdVar4) {
        memset(pdVar1,0,((long)pdVar4 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
      bVar14 = 0 < this->num_column_;
      if (0 < this->num_column_) {
        lVar15 = 0;
        do {
          iVar2 = this->num_row_;
          if (0 < (long)iVar2) {
            ppdVar6 = (real_part_input->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            ppdVar7 = (imag_part_input->index_).
                      super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar13 = 0;
            do {
              pdVar3[lVar13] = ppdVar6[lVar13][lVar15];
              pdVar5[lVar13] = ppdVar7[lVar13][lVar15];
              lVar13 = lVar13 + 1;
            } while (iVar2 != lVar13);
          }
          bVar9 = InverseFastFourierTransform::Run
                            (&this->inverse_fast_fourier_transform_,this_00,this_01,
                             (this_02->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15,
                             (this_03->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15);
          if (!bVar9) {
            if (bVar14) goto LAB_00106fa0;
            break;
          }
          lVar15 = lVar15 + 1;
          bVar14 = lVar15 < this->num_column_;
        } while (lVar15 < this->num_column_);
      }
      pdVar4 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar2 = this->num_column_;
      pdVar1 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + iVar2;
      if (pdVar1 != pdVar4) {
        memset(pdVar1,0,((long)pdVar4 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
      pdVar4 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pdVar1 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + iVar2;
      if (pdVar1 != pdVar4) {
        memset(pdVar1,0,((long)pdVar4 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
      bVar14 = 0 < this->fft_length_;
      if (0 < this->fft_length_) {
        lVar15 = 0;
        do {
          iVar2 = this->num_column_;
          if (0 < (long)iVar2) {
            pvVar10 = (this_02->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pvVar11 = (this_03->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar13 = 0;
            do {
              pdVar3[lVar13] =
                   *(double *)
                    (*(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar15 * 8);
              pdVar5[lVar13] =
                   *(double *)
                    (*(long *)&(pvVar11->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar15 * 8);
              lVar13 = lVar13 + 1;
              pvVar10 = pvVar10 + 1;
              pvVar11 = pvVar11 + 1;
            } while (iVar2 != lVar13);
          }
          bVar9 = InverseFastFourierTransform::Run
                            (&this->inverse_fast_fourier_transform_,this_00,this_01,
                             (this_04->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15,
                             (this_05->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar15);
          if (!bVar9) {
            if (bVar14) goto LAB_00106fa0;
            break;
          }
          lVar15 = lVar15 + 1;
          bVar14 = lVar15 < this->fft_length_;
        } while (lVar15 < this->fft_length_);
      }
      bVar14 = true;
      if (0 < this->fft_length_) {
        lVar15 = 1;
        lVar13 = 0;
        do {
          pvVar10 = (this_04->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = *(void **)((long)pvVar10 + lVar15 * 8 + -8);
          sVar12 = *(long *)((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar15 * 8) - (long)pvVar8;
          if (sVar12 != 0) {
            memmove((real_part_output->index_).
                    super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13],pvVar8,sVar12);
          }
          pvVar10 = (this_05->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = *(void **)((long)pvVar10 + lVar15 * 8 + -8);
          sVar12 = *(long *)((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar15 * 8) - (long)pvVar8;
          if (sVar12 != 0) {
            memmove((imag_part_output->index_).
                    super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13],pvVar8,sVar12);
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 3;
        } while (lVar13 < this->fft_length_);
      }
    }
  }
  else {
LAB_00106fa0:
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool TwoDimensionalInverseFastFourierTransform::Run(
    const Matrix& real_part_input, const Matrix& imag_part_input,
    Matrix* real_part_output, Matrix* imag_part_output,
    TwoDimensionalInverseFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || real_part_input.GetNumRow() != num_row_ ||
      real_part_input.GetNumColumn() != num_column_ ||
      imag_part_input.GetNumRow() != num_row_ ||
      imag_part_input.GetNumColumn() != num_column_ ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  {
    const std::size_t size(static_cast<std::size_t>(fft_length_));
    if (buffer->real_part_input_.size() != size) {
      buffer->real_part_input_.resize(size);
    }
    if (buffer->imag_part_input_.size() != size) {
      buffer->imag_part_input_.resize(size);
    }
    if (buffer->first_real_part_outputs_.size() != size) {
      buffer->first_real_part_outputs_.resize(size);
    }
    if (buffer->first_imag_part_outputs_.size() != size) {
      buffer->first_imag_part_outputs_.resize(size);
    }
    if (buffer->second_real_part_outputs_.size() != size) {
      buffer->second_real_part_outputs_.resize(size);
    }
    if (buffer->second_imag_part_outputs_.size() != size) {
      buffer->second_imag_part_outputs_.resize(size);
    }
    if (real_part_output->GetNumRow() != fft_length_ ||
        real_part_output->GetNumColumn() != fft_length_) {
      real_part_output->Resize(fft_length_, fft_length_);
    }
    if (imag_part_output->GetNumRow() != fft_length_ ||
        imag_part_output->GetNumColumn() != fft_length_) {
      imag_part_output->Resize(fft_length_, fft_length_);
    }
  }

  double* x(&buffer->real_part_input_[0]);
  double* y(&buffer->imag_part_input_[0]);

  // First stage.
  std::fill(buffer->real_part_input_.begin() + num_row_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_row_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      x[j] = real_part_input[j][i];
      y[j] = imag_part_input[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->first_real_part_outputs_[i],
            &buffer->first_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Second stage.
  std::fill(buffer->real_part_input_.begin() + num_column_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_column_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < fft_length_; ++i) {
    for (int j(0); j < num_column_; ++j) {
      x[j] = buffer->first_real_part_outputs_[j][i];
      y[j] = buffer->first_imag_part_outputs_[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->second_real_part_outputs_[i],
            &buffer->second_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Save results.
  for (int i(0); i < fft_length_; ++i) {
    std::copy(buffer->second_real_part_outputs_[i].begin(),
              buffer->second_real_part_outputs_[i].end(),
              (*real_part_output)[i]);
    std::copy(buffer->second_imag_part_outputs_[i].begin(),
              buffer->second_imag_part_outputs_[i].end(),
              (*imag_part_output)[i]);
  }

  return true;
}